

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Base64.c
# Opt level: O1

WJTL_STATUS TestBase64Encode(void)

{
  char *pcVar1;
  int i;
  JL_STATUS JVar2;
  int iVar3;
  JL_STATUS JVar4;
  int iVar5;
  JL_STATUS JVar6;
  int iVar7;
  JL_STATUS JVar8;
  int iVar9;
  JL_STATUS JVar10;
  int iVar11;
  undefined1 *puVar12;
  WJTL_STATUS WVar13;
  undefined1 uVar14;
  long lVar15;
  char *string;
  uint8_t data [3];
  uint8_t data3 [256];
  uint8_t data2 [768];
  char *local_468;
  undefined2 local_45c;
  undefined1 local_45a;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 local_438 [256];
  undefined1 local_338 [2];
  undefined1 local_336 [774];
  
  local_45a = 3;
  local_45c = 0x201;
  lVar15 = 0;
  local_468 = (char *)0x0;
  JVar2 = JlBase64Encode(&local_45c,1,&local_468);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 1, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2a);
  local_440 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2b);
  iVar3 = strcmp(local_468,"AQ");
  WjTestLib_Assert(iVar3 == 0,"strcmp( string, \"AQ\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2c);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar4 = JlBase64Encode(&local_45c,2,&local_468);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 2, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2f);
  local_448 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x30);
  iVar5 = strcmp(local_468,"AQI");
  WjTestLib_Assert(iVar5 == 0,"strcmp( string, \"AQI\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x31);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar6 = JlBase64Encode(&local_45c,3,&local_468);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 3, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x34);
  local_450 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x35);
  iVar7 = strcmp(local_468,"AQID");
  WjTestLib_Assert(iVar7 == 0,"strcmp( string, \"AQID\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x36);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  puVar12 = local_336;
  do {
    uVar14 = (undefined1)lVar15;
    puVar12[-2] = uVar14;
    puVar12[-1] = uVar14;
    *puVar12 = uVar14;
    lVar15 = lVar15 + 1;
    puVar12 = puVar12 + 3;
  } while (lVar15 != 0x100);
  JVar8 = JlBase64Encode(local_338,0x300,&local_468);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data2, sizeof(data2), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x52);
  local_458 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x53);
  iVar9 = strcmp(local_468,
                 "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8PEBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8fICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8vMDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09PUFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19fYGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29vcHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+PkJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+foKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+vsLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////"
                );
  WjTestLib_Assert(iVar9 == 0,"strcmp( string, data2Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x54);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  lVar15 = 0;
  do {
    local_438[lVar15] = (char)lVar15;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x100);
  JVar10 = JlBase64Encode(local_438,0x100,&local_468);
  WjTestLib_Assert(JVar10 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data3, sizeof(data3), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x65);
  pcVar1 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x66);
  iVar11 = strcmp(local_468,
                  "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4vMDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5fYGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6PkJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v8PHy8/T19vf4+fr7/P3+/w"
                 );
  WVar13 = WJTL_STATUS_SUCCESS;
  if (((JVar4 != JL_STATUS_SUCCESS || iVar5 != 0) || (iVar3 != 0 || JVar2 != JL_STATUS_SUCCESS)) ||
      JVar6 != JL_STATUS_SUCCESS) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if (local_440 == (char *)0x0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if (local_448 == (char *)0x0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if (local_450 == (char *)0x0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if ((((JVar8 != JL_STATUS_SUCCESS || iVar7 != 0) || iVar9 != 0) || JVar10 != JL_STATUS_SUCCESS) ||
      iVar11 != 0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if (local_458 == (char *)0x0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  if (pcVar1 == (char *)0x0) {
    WVar13 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(iVar11 == 0,"strcmp( string, data3Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x67);
  WjTestLib_Free(local_468);
  return WVar13;
}

Assistant:

static
WJTL_STATUS
    TestBase64Encode
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    uint8_t data[] = { 1, 2, 3 };
    char* string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 1, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQ" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 2, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQI" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 3, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQID" ) == 0 );
    JlFree( string );  string = NULL;

    uint8_t data2[256*3];
    for( int i=0; i<256; i++ )
    {
        data2[i*3 + 0] = (uint8_t)i;
        data2[i*3 + 1] = (uint8_t)i;
        data2[i*3 + 2] = (uint8_t)i;
    }
    char const* data2Result =
        "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8P"
        "EBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8f"
        "ICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8v"
        "MDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/"
        "QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09P"
        "UFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19f"
        "YGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29v"
        "cHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/"
        "gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+P"
        "kJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+f"
        "oKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+v"
        "sLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/"
        "wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P"
        "0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f"
        "4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v"
        "8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////";

    JL_ASSERT_SUCCESS( JlBase64Encode( data2, sizeof(data2), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data2Result) == 0 );

    JlFree( string ); string = NULL;

    uint8_t data3[256];
    for( int i=0; i<256; i++ )
    {
        data3[i] = (uint8_t)i;
    }
    char const* data3Result =
        "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4v"
        "MDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5f"
        "YGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6P"
        "kJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/"
        "wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v"
        "8PHy8/T19vf4+fr7/P3+/w";

    JL_ASSERT_SUCCESS( JlBase64Encode( data3, sizeof(data3), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data3Result) == 0 );

    JlFree( string ); string = NULL;

    return TestReturn;
}